

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commander.cpp
# Opt level: O2

Command * __thiscall Commander::getCommand(Commander *this,string *line)

{
  iterator iVar1;
  mapped_type *ppCVar2;
  ostream *poVar3;
  mapped_type pCVar4;
  string name;
  key_type kStack_38;
  
  std::__cxx11::string::string((string *)&kStack_38,(string *)line);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
          ::find(&(this->cmds)._M_t,&kStack_38);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->cmds)._M_t._M_impl.super__Rb_tree_header) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"No such command");
    std::endl<char,std::char_traits<char>>(poVar3);
    pCVar4 = (mapped_type)0x0;
  }
  else {
    ppCVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
              ::operator[](&this->cmds,&kStack_38);
    pCVar4 = *ppCVar2;
  }
  std::__cxx11::string::~string((string *)&kStack_38);
  return pCVar4;
}

Assistant:

Command* Commander::getCommand(const std::string& line)
{
    std::string name = line;
    //TODO: split the line...
    if (cmds.find(name) == cmds.end() ) {
       std::cerr << "No such command" << endl;
       return NULL;
    }

    Command *cmd = this->cmds[name];
    return cmd;
}